

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O0

double r8_psi(double xx)

{
  int iVar1;
  double dVar2;
  double zero;
  double z;
  double xsmall;
  double xmin1;
  double xmax1;
  double xlarge;
  double xinf;
  double x02;
  double x01d;
  double x01;
  double x;
  double w;
  double value;
  double upper;
  double three;
  double sgn;
  double q2 [6];
  double q1 [8];
  double piov4;
  double p2 [7];
  double local_a8;
  double p1 [9];
  double one;
  int nq;
  int n;
  int i;
  double half;
  double fourth;
  double four;
  double den;
  double aug;
  double xx_local;
  
  memcpy(&local_a8,&DAT_002638e0,0x48);
  memcpy(&piov4,&DAT_00263930,0x38);
  memcpy(q2 + 5,&DAT_00263970,0x40);
  memset(&sgn,0,0x30);
  sgn = 44.992760373789366;
  q2[0] = 202.40955312679932;
  q2[1] = 247.3697900331529;
  q2[2] = 107.42543875702279;
  q2[3] = 17.46396506067857;
  q2[4] = 0.8842752039887348;
  dVar2 = ABS(xx);
  den = 0.0;
  if ((3.6e+16 <= -xx) || (dVar2 < 5.89e-39)) {
    if (xx <= 0.0) {
      w = 1.7e+38;
    }
    else {
      w = -1.7e+38;
    }
    xx_local = w;
  }
  else {
    x01 = xx;
    if (xx < 0.5) {
      if (2.05e-09 < dVar2) {
        if (0.0 <= xx) {
          three = -0.7853981633974483;
        }
        else {
          three = 0.7853981633974483;
        }
        iVar1 = (int)((dVar2 - (double)(int)dVar2) * 4.0);
        x = (-(double)iVar1 * 0.25 + (dVar2 - (double)(int)dVar2)) * 4.0;
        if ((iVar1 / 2) * 2 != iVar1) {
          x = 1.0 - x;
        }
        dVar2 = x * 0.7853981633974483;
        if ((iVar1 / 2) % 2 != 0) {
          three = -three;
        }
        if (((iVar1 + 1) / 2) % 2 == 0) {
          if ((dVar2 == 0.0) && (!NAN(dVar2))) {
            if (xx <= 0.0) {
              w = 1.7e+38;
            }
            else {
              w = -1.7e+38;
            }
            return w;
          }
          dVar2 = tan(dVar2);
          dVar2 = 4.0 / dVar2;
        }
        else {
          dVar2 = tan(dVar2);
          dVar2 = dVar2 * 4.0;
        }
        den = three * dVar2;
      }
      else {
        den = -1.0 / xx;
      }
      x01 = 1.0 - xx;
    }
    if (3.0 < x01) {
      if (x01 < 2.04e+15) {
        dVar2 = 1.0 / (x01 * x01);
        four = dVar2;
        for (nq = 1; value = piov4 * dVar2, nq < 6; nq = nq + 1) {
          four = (four + q2[(long)(nq + -1) + -1]) * dVar2;
          piov4 = value + p2[(long)nq + -1];
        }
        den = ((value + p2[5]) / (four + q2[4]) - 0.5 / x01) + den;
      }
      dVar2 = log(x01);
      xx_local = den + dVar2;
    }
    else {
      four = x01;
      for (nq = 1; value = local_a8 * x01, nq < 8; nq = nq + 1) {
        four = (four + q2[(long)(nq + -1) + 5]) * x01;
        local_a8 = value + p1[(long)nq + -1];
      }
      xx_local = ((value + p1[7]) / (four + q1[6])) * ((x01 - 1.4609375) - 0.0006946449683623413) +
                 den;
    }
  }
  return xx_local;
}

Assistant:

double r8_psi ( double xx )

//****************************************************************************80
//
//  Purpose:
//
//    R8_PSI evaluates the function Psi(X).
//
//  Discussion:
//
//    This routine evaluates the logarithmic derivative of the
//    Gamma function,
//
//      PSI(X) = d/dX ( GAMMA(X) ) / GAMMA(X)
//             = d/dX LN ( GAMMA(X) )
//
//    for real X, where either
//
//      - XMAX1 < X < - XMIN, and X is not a negative integer,
//
//    or
//
//      XMIN < X.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    09 February 2008
//
//  Author:
//
//    Original FORTRAN77 version by William Cody.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    William Cody, Anthony Strecok, Henry Thacher,
//    Chebyshev Approximations for the Psi Function,
//    Mathematics of Computation,
//    Volume 27, Number 121, January 1973, pages 123-127.
//
//  Parameters:
//
//    Input, double XX, the argument of the function.
//
//    Output, double R8_PSI, the value of the function.
//
{
  double aug;
  double den;
  double four = 4.0;
  double fourth = 0.25;
  double half = 0.5;
  int i;
  int n;
  int nq;
  double one = 1.0;
  double p1[9] = { 
   4.5104681245762934160E-03, 
   5.4932855833000385356, 
   3.7646693175929276856E+02, 
   7.9525490849151998065E+03, 
   7.1451595818951933210E+04, 
   3.0655976301987365674E+05, 
   6.3606997788964458797E+05, 
   5.8041312783537569993E+05, 
   1.6585695029761022321E+05 };
  double p2[7] = { 
  -2.7103228277757834192, 
  -1.5166271776896121383E+01, 
  -1.9784554148719218667E+01, 
  -8.8100958828312219821, 
  -1.4479614616899842986, 
  -7.3689600332394549911E-02, 
  -6.5135387732718171306E-21 };
  double piov4 = 0.78539816339744830962;
  double q1[8] = { 
   9.6141654774222358525E+01, 
   2.6287715790581193330E+03, 
   2.9862497022250277920E+04, 
   1.6206566091533671639E+05, 
   4.3487880712768329037E+05, 
   5.4256384537269993733E+05, 
   2.4242185002017985252E+05, 
   6.4155223783576225996E-08 };
  double q2[6] = { 
   4.4992760373789365846E+01, 
   2.0240955312679931159E+02, 
   2.4736979003315290057E+02, 
   1.0742543875702278326E+02, 
   1.7463965060678569906E+01, 
   8.8427520398873480342E-01 };
  double sgn;
  double three = 3.0;
  double upper;
  double value;
  double w;
  double x;
  double x01 = 187.0;
  double x01d = 128.0;
  double x02 = 6.9464496836234126266E-04;
  double xinf = 1.70E+38;
  double xlarge = 2.04E+15;
  double xmax1 = 3.60E+16;
  double xmin1 = 5.89E-39;
  double xsmall = 2.05E-09;
  double z;
  double zero = 0.0;

  x = xx;
  w = fabs ( x );
  aug = zero;
//
//  Check for valid arguments, then branch to appropriate algorithm.
//
  if ( xmax1 <= - x || w < xmin1 )
  {
    if ( zero < x )
    {
      value = - xinf;
    }
    else
    {
      value = xinf;
    }
    return value;
  }

  if ( x < half )
  {
//
//  X < 0.5, use reflection formula: psi(1-x) = psi(x) + pi * cot(pi*x)
//  Use 1/X for PI*COTAN(PI*X)  when  XMIN1 < |X| <= XSMALL.
//
    if ( w <= xsmall )
    {
      aug = - one / x;
    }
//
//  Argument reduction for cotangent.
//
    else
    {
      if ( x < zero )
      {
        sgn = piov4;
      }
      else
      {
        sgn = - piov4;
      }

      w = w - double( int( w ) );
      nq = int ( w * four );
      w = four * ( w - double( nq ) * fourth );
//
//  W is now related to the fractional part of 4.0 * X.
//  Adjust argument to correspond to values in the first
//  quadrant and determine the sign.
//
      n = nq / 2;

      if ( n + n != nq )
      {
        w = one - w;
      }

      z = piov4 * w;

      if ( ( n % 2 ) != 0 )
      {
        sgn = - sgn;
      }
//
//  Determine the final value for  -pi * cotan(pi*x).
//
      n = ( nq + 1 ) / 2;
      if ( ( n % 2 ) == 0 )
      {
//
//  Check for singularity.
//
        if ( z == zero )
        {
          if ( zero < x )
          {
            value = -xinf;
          }
          else
          {
            value = xinf;
          }
          return value;
        }
        aug = sgn * ( four / tan ( z ) );
      }
      else
      {
        aug = sgn * ( four * tan ( z ) );
      }
    }
    x = one - x;
  }
//
//  0.5 <= X <= 3.0.
//
  if ( x <= three )
  {
    den = x;
    upper = p1[0] * x;
    for ( i = 1; i <= 7; i++ )
    {
      den = ( den + q1[i-1] ) * x;
      upper = ( upper + p1[i]) * x;
    }
    den = ( upper + p1[8] ) / ( den + q1[7] );
    x = ( x - x01 / x01d ) - x02;
    value = den * x + aug;
    return value;
  }
//
//  3.0 < X.
//
  if ( x < xlarge )
  {
    w = one / ( x * x );
    den = w;
    upper = p2[0] * w;
    for ( i = 1; i <= 5; i++ )
    {
      den = ( den + q2[i-1] ) * w;
      upper = ( upper + p2[i] ) * w;
    }
    aug = ( upper + p2[6] ) / ( den + q2[5] ) - half / x + aug;
  }

  value = aug + log ( x );

  return value;
}